

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

string * __thiscall
proto2_unittest::TestOneof2::_internal_mutable_foo_string_abi_cxx11_(TestOneof2 *this)

{
  FooCase FVar1;
  Arena *arena;
  string *psVar2;
  TestOneof2 *this_local;
  
  FVar1 = foo_case(this);
  if (FVar1 != kFooString) {
    clear_foo(this);
    set_has_foo_string(this);
    google::protobuf::internal::ArenaStringPtr::InitDefault
              (&(this->field_0)._impl_.foo_.foo_string_);
  }
  arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  psVar2 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(this->field_0)._impl_.foo_.foo_string_,arena);
  return psVar2;
}

Assistant:

inline ::std::string* PROTOBUF_NONNULL TestOneof2::_internal_mutable_foo_string() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (foo_case() != kFooString) {
    clear_foo();

    set_has_foo_string();
    _impl_.foo_.foo_string_.InitDefault();
  }
  return _impl_.foo_.foo_string_.Mutable( GetArena());
}